

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O2

ostream * __thiscall
inja::Environment::render_to(Environment *this,ostream *os,Template *tmpl,json *data)

{
  Renderer local_90;
  
  Renderer::Renderer(&local_90,&this->m_included_templates,&this->m_callbacks);
  Renderer::render_to(&local_90,os,tmpl,data);
  Renderer::~Renderer(&local_90);
  return os;
}

Assistant:

std::ostream& render_to(std::ostream& os, const Template& tmpl, const json& data) {
    Renderer(m_included_templates, m_callbacks).render_to(os, tmpl, data);
    return os;
  }